

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O2

RealType __thiscall
OpenMD::Mie::getSuggestedCutoffRadius(Mie *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  RealType RVar5;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar2 = AtomType::getIdent(atypes.first);
  iVar3 = AtomType::getIdent(atypes.second);
  piVar1 = (this->MieTids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)piVar1[iVar2];
  iVar2 = piVar1[iVar3];
  RVar5 = 0.0;
  if (iVar2 != -1 && lVar4 != -1) {
    RVar5 = *(double *)
             (*(long *)&(this->MixingMap).
                        super__Vector_base<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar4].
                        super__Vector_base<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>
                        ._M_impl.super__Vector_impl_data + (long)iVar2 * 0x28) * 2.5;
  }
  return RVar5;
}

Assistant:

RealType Mie::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    int atid1   = atypes.first->getIdent();
    int atid2   = atypes.second->getIdent();
    int mietid1 = MieTids[atid1];
    int mietid2 = MieTids[atid2];

    if (mietid1 == -1 || mietid2 == -1)
      return 0.0;
    else {
      MieInteractionData mixer = MixingMap[mietid1][mietid2];
      return 2.5 * mixer.sigma;
    }
  }